

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O0

QRect __thiscall QAccessibleTable::rect(QAccessibleTable *this)

{
  long lVar1;
  QRect QVar2;
  bool bVar3;
  QWidget *this_00;
  long in_FS_OFFSET;
  QPoint pos;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  QRect *in_stack_ffffffffffffffa8;
  undefined8 local_18;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  view((QAccessibleTable *)0x7f5dca);
  bVar3 = QWidget::isVisible((QWidget *)0x7f5dd2);
  if (bVar3) {
    this_00 = (QWidget *)view((QAccessibleTable *)0x7f5dfb);
    QPoint::QPoint((QPoint *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
    QWidget::mapToGlobal(this_00,(QPoint *)in_stack_ffffffffffffffa8);
    QPoint::x((QPoint *)0x7f5e2c);
    QPoint::y((QPoint *)0x7f5e3a);
    view((QAccessibleTable *)0x7f5e48);
    QWidget::width((QWidget *)0x7f5e50);
    view((QAccessibleTable *)0x7f5e5e);
    QWidget::height((QWidget *)0x7f5e66);
    QRect::QRect(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,
                 in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
  }
  else {
    QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    QVar2._8_8_ = local_10;
    QVar2._0_8_ = local_18;
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QRect QAccessibleTable::rect() const
{
    if (!view()->isVisible())
        return QRect();
    QPoint pos = view()->mapToGlobal(QPoint(0, 0));
    return QRect(pos.x(), pos.y(), view()->width(), view()->height());
}